

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVertex.cpp
# Opt level: O0

void __thiscall SimpleVertex::transform(SimpleVertex *this,array<double,_16UL> *matrix)

{
  undefined8 in_RSI;
  array<double,_16UL> *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  SimpleVertex *unaff_retaddr;
  double new_z;
  double new_y;
  double new_x;
  double new_w;
  int index;
  array<double,_16UL> *matrix_00;
  
  index = (int)((ulong)in_RSI >> 0x20);
  matrix_00 = in_RDI;
  dVar1 = multiply(unaff_retaddr,in_RDI,index);
  dVar2 = multiply(unaff_retaddr,matrix_00,index);
  dVar3 = multiply(unaff_retaddr,matrix_00,index);
  dVar4 = multiply(unaff_retaddr,matrix_00,index);
  in_RDI->_M_elems[0] = dVar2 / dVar1;
  in_RDI->_M_elems[1] = dVar3 / dVar1;
  in_RDI->_M_elems[2] = dVar4 / dVar1;
  return;
}

Assistant:

void SimpleVertex::transform(const std::array<double, 16> &matrix) {
    double new_w = multiply(matrix, 12);
    double new_x = multiply(matrix, 0) / new_w;
    double new_y = multiply(matrix, 4) / new_w;
    double new_z = multiply(matrix, 8) / new_w;

    x = new_x;
    y = new_y;
    z = new_z;
}